

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void emit_ARB1_global(Context *ctx,RegisterType regtype,int regnum)

{
  uint uVar1;
  char *pcVar2;
  byte bVar3;
  size_t in_R8;
  char varname [64];
  char regnum_str [16];
  char acStack_78 [64];
  char local_38 [24];
  
  pcVar2 = get_D3D_register_string(ctx,regtype,regnum,local_38,in_R8);
  snprintf(acStack_78,0x40,"%s%s",pcVar2,local_38);
  push_output(ctx,&ctx->globals);
  if (regtype == REG_TYPE_TEMP) {
    pcVar2 = "FLOAT TEMP";
    if (ctx->profile_supports_nv4 == 0) {
      pcVar2 = "TEMP";
    }
    output_line(ctx,"%s %s;",pcVar2,acStack_78);
  }
  else if (regtype == REG_TYPE_ADDRESS) {
    if (ctx->shader_type == MOJOSHADER_TYPE_PIXEL) {
      bVar3 = 0;
      if (ctx->minor_ver != 0xff) {
        bVar3 = ctx->minor_ver;
      }
      if (((uint)bVar3 | (uint)ctx->major_ver << 0x10) < 0x10004) {
        pcVar2 = "FLOAT TEMP";
        if (ctx->profile_supports_nv4 == 0) {
          pcVar2 = "TEMP";
        }
        output_line(ctx,"%s %s;",pcVar2,acStack_78);
        push_output(ctx,&ctx->mainline_top);
        output_line(ctx,"MOV %s, fragment.texcoord[%d];",acStack_78,(ulong)(uint)regnum);
        if (ctx->output_stack_len < 1) goto LAB_00111bd6;
        uVar1 = ctx->output_stack_len - 1;
        ctx->output_stack_len = uVar1;
        ctx->output = ctx->output_stack[uVar1];
        ctx->indent = ctx->indent_stack[uVar1];
      }
    }
    else if (ctx->profile_supports_nv4 == 0) {
      output_line(ctx,"ADDRESS %s;",acStack_78);
      if (ctx->profile_supports_nv2 == 0) {
        output_line(ctx,"TEMP addr%d;",(ulong)(uint)regnum);
      }
    }
    else {
      output_line(ctx,"INT TEMP %s;",acStack_78);
    }
  }
  else {
    failf(ctx,"%s","BUG: we used a register we don\'t know how to define.");
  }
  if (0 < ctx->output_stack_len) {
    uVar1 = ctx->output_stack_len - 1;
    ctx->output_stack_len = uVar1;
    ctx->output = ctx->output_stack[uVar1];
    ctx->indent = ctx->indent_stack[uVar1];
    return;
  }
LAB_00111bd6:
  __assert_fail("ctx->output_stack_len > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                ,0x173,"void pop_output(Context *)");
}

Assistant:

static void emit_ARB1_global(Context *ctx, RegisterType regtype, int regnum)
{
    // !!! FIXME: dependency on ARB1 profile.  // !!! FIXME about FIXME: huh?
    char varname[64];
    get_ARB1_varname_in_buf(ctx, regtype, regnum, varname, sizeof (varname));

    push_output(ctx, &ctx->globals);
    switch (regtype)
    {
        case REG_TYPE_ADDRESS:
            if (shader_is_pixel(ctx))  // actually REG_TYPE_TEXTURE.
            {
                // We have to map texture registers to temps for ps_1_1, since
                //  they work like temps, initialize with tex coords, and the
                //  ps_1_1 TEX opcode expects to overwrite it.
                if (!shader_version_atleast(ctx, 1, 4))
                {
                    output_line(ctx, "%s %s;", arb1_float_temp(ctx), varname);
                    push_output(ctx, &ctx->mainline_top);
                    output_line(ctx, "MOV %s, fragment.texcoord[%d];",
                                varname, regnum);
                    pop_output(ctx);
                } // if
                break;
            } // if

            // nv4 replaced address registers with generic int registers.
            if (support_nv4(ctx))
                output_line(ctx, "INT TEMP %s;", varname);
            else
            {
                // nv2 has four-component address already, but stock arb1 has
                //  to emulate it in a temporary, and move components to the
                //  scalar ADDRESS register on demand.
                output_line(ctx, "ADDRESS %s;", varname);
                if (!support_nv2(ctx))
                    output_line(ctx, "TEMP addr%d;", regnum);
            } // else
            break;

        //case REG_TYPE_PREDICATE:
        //    output_line(ctx, "bvec4 %s;", varname);
        //    break;
        case REG_TYPE_TEMP:
            output_line(ctx, "%s %s;", arb1_float_temp(ctx), varname);
            break;
        //case REG_TYPE_LOOP:
        //    break; // no-op. We declare these in for loops at the moment.
        //case REG_TYPE_LABEL:
        //    break; // no-op. If we see it here, it means we optimized it out.
        default:
            fail(ctx, "BUG: we used a register we don't know how to define.");
            break;
    } // switch
    pop_output(ctx);
}